

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeMessageTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  uint *puVar1;
  uint32_t uVar2;
  int num_fields;
  int cached_size;
  uint8_t *base;
  FieldMetadata *field_table;
  SerializationTable *table;
  ArrayOutput *output_local;
  void *table_ptr_local;
  MessageLite *msg_local;
  
  if (table_ptr == (void *)0x0) {
    uVar2 = (*msg->_vptr_MessageLite[9])();
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(uVar2,output);
    SerializeMessageNoTable(msg,output);
  }
  else {
    puVar1 = *(uint **)((long)table_ptr + 8);
    uVar2 = *(uint32_t *)((long)&msg->_vptr_MessageLite + (ulong)*puVar1);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(uVar2,output);
    SerializeMessageDispatch(msg,(FieldMetadata *)(puVar1 + 6),*table_ptr + -1,uVar2,output);
  }
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8_t* base = reinterpret_cast<const uint8_t*>(msg);
  int cached_size =
      *reinterpret_cast<const int32_t*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}